

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,
               QPointingDevice *args_4,QFlags<Qt::MouseButton> args_5,double args_6,double args_7,
               double args_8,double args_9,double args_10,int args_11,
               QFlags<Qt::KeyboardModifier> args_12)

{
  long *plVar1;
  bool bVar2;
  TabletEvent *this;
  long in_FS_OFFSET;
  QPointF QStack_58;
  QPointF QStack_48;
  long lStack_38;
  
  QStack_58.yp = args_3.yp;
  QStack_58.xp = args_3.xp;
  QStack_48.yp = args_2.yp;
  QStack_48.xp = args_2.xp;
  if (QWindowSystemInterfacePrivate::synchronousWindowSystemEvents) {
    bVar2 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
            handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
                      (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10,
                       args_11,args_12);
    return bVar2;
  }
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = (TabletEvent *)operator_new(0x98);
  QWindowSystemInterfacePrivate::TabletEvent::TabletEvent
            (this,args,args_1,&QStack_48,&QStack_58,args_4,
             (MouseButtons)
             args_5.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
             super_QFlagsStorage<Qt::MouseButton>.i,args_6,args_7,args_8,args_9,args_10,args_11,
             (KeyboardModifiers)
             args_12.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
             super_QFlagsStorage<Qt::KeyboardModifier>.i);
  QWindowSystemInterfacePrivate::WindowSystemEventList::append
            (&QWindowSystemInterfacePrivate::windowSystemEventQueue,(WindowSystemEvent *)this);
  if ((QCoreApplication::self != 0) &&
     (plVar1 = *(long **)(*(long *)(*(long *)(QCoreApplication::self + 8) + 0x58) + 0x60),
     plVar1 != (long *)0x0)) {
    (**(code **)(*plVar1 + 0xa0))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::handleEvent(Args ...args)
{
    return QWindowSystemInterfacePrivate::synchronousWindowSystemEvents
        ? QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent<EventType>(args...)
        : QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
}